

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall
VulkanHppGenerator::appendRAIIDispatcherCommands
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *listedCommands,string *title,string *contextInitializers,string *contextMembers,
          string *deviceAssignments,string *deviceMembers,string *instanceAssignments,
          string *instanceMembers)

{
  _Base_ptr *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  string *title_00;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pRVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pNVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  _Base_ptr p_Var14;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  string ia;
  string da;
  string imp;
  string im;
  string dmp;
  string dm;
  string cm;
  string ci;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  pointer local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  VulkanHppGenerator *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  string *local_68;
  string *local_60;
  pointer local_58;
  pointer local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
  *local_48;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_40;
  pointer local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  pRVar6 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_1c8 = this;
  local_70 = contextMembers;
  local_68 = contextInitializers;
  local_60 = title;
  local_40 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)listedCommands;
  if (pRVar6 != local_58) {
    local_48 = &this->m_commands;
    paVar1 = &local_270.field_2;
    do {
      pNVar11 = (pRVar6->commands).
                super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pRVar6->commands).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = pRVar6;
      if (pNVar11 != local_38) {
        do {
          paVar10 = &local_208.field_2;
          local_210 = pNVar11;
          pVar15 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>(local_40,&pNVar11->name);
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_198 = (_Base_ptr)
                        anon_unknown.dwarf_1900a8::
                        findByNameOrAlias<VulkanHppGenerator::CommandData>
                                  (local_48,&local_210->name);
            if (local_198[4]._M_left == (_Base_ptr)0x0) {
              std::operator+(&local_1c0,", ",&local_210->name);
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_1c0,"( PFN_");
              local_1e8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
              paVar7 = &pbVar5->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p == paVar7) {
                local_1e8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              }
              else {
                local_1e8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              }
              local_1e8._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1e8,(local_210->name)._M_dataplus._M_p,
                                  (local_210->name)._M_string_length);
              local_208._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
              paVar7 = &pbVar5->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p == paVar7) {
                local_208.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                local_208._M_dataplus._M_p = (pointer)paVar10;
              }
              else {
                local_208.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              }
              local_208._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_208,"( getProcAddr( NULL, \"");
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar8 = &pbVar5->field_2;
              if (paVar7 == paVar8) {
                local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_230._M_dataplus._M_p = (pointer)paVar7;
              }
              local_230._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_230,(local_210->name)._M_dataplus._M_p,
                                  (local_210->name)._M_string_length);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar8 = &pbVar5->field_2;
              if (paVar7 == paVar8) {
                local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_250._M_dataplus._M_p = (pointer)paVar7;
              }
              local_250._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_250,"\" ) ) )");
              local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
              paVar7 = &pbVar5->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p == paVar7) {
                local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                local_270._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              }
              local_270._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,local_270._M_dataplus._M_p,local_270._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != paVar1) {
                operator_delete(local_270._M_dataplus._M_p,
                                local_270.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != paVar10) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                operator_delete(local_1c0._M_dataplus._M_p,
                                local_1c0.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_208,"      PFN_",&local_210->name);
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_208," ");
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar8 = &pbVar5->field_2;
              if (paVar7 == paVar8) {
                local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_230._M_dataplus._M_p = (pointer)paVar7;
              }
              local_230._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_230,(local_210->name)._M_dataplus._M_p,
                                  (local_210->name)._M_string_length);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar5->_M_dataplus)._M_p;
              paVar8 = &pbVar5->field_2;
              if (paVar7 == paVar8) {
                local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              }
              else {
                local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_250._M_dataplus._M_p = (pointer)paVar7;
              }
              local_250._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              pbVar5 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_250," = 0;\n");
              local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
              paVar7 = &pbVar5->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p == paVar7) {
                local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                local_270._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              }
              local_270._M_string_length = pbVar5->_M_string_length;
              (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
              pbVar5->_M_string_length = 0;
              (pbVar5->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_b0,local_270._M_dataplus._M_p,local_270._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != paVar1) {
                operator_delete(local_270._M_dataplus._M_p,
                                local_270.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              uVar12 = local_208.field_2._M_allocated_capacity;
              _Var13._M_p = local_208._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != paVar10) goto LAB_00130a5a;
            }
            else {
              this_00 = &local_198[4]._M_parent;
              local_1a0 = local_198;
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_00,"VkDevice");
              if (iVar4 == 0) {
                bVar3 = true;
              }
              else {
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"VkDevice","");
                bVar3 = hasParentHandle(local_1c8,(string *)this_00,&local_150);
              }
              p_Var14 = local_1a0;
              if ((iVar4 != 0) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2)) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
              p_Var14 = p_Var14 + 1;
              if (bVar3 == false) {
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)this_00,"VkInstance");
                if (iVar4 != 0) {
                  local_270._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_270,"VkInstance","");
                  bVar3 = hasParentHandle(local_1c8,(string *)this_00,&local_270);
                  if (!bVar3) {
                    __assert_fail("( commandIt->second.handle == \"VkInstance\" ) || hasParentHandle( commandIt->second.handle, \"VkInstance\" )"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                  ,0x2f8,
                                  "void VulkanHppGenerator::appendRAIIDispatcherCommands(const std::vector<RequireData> &, std::set<std::string> &, const std::string &, std::string &, std::string &, std::string &, std::string &, std::string &, std::string &) const"
                                 );
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p != paVar1) {
                    operator_delete(local_270._M_dataplus._M_p,
                                    local_270.field_2._M_allocated_capacity + 1);
                  }
                }
                pNVar11 = local_210;
                local_1a0 = p_Var14;
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_210->name,"vkGetInstanceProcAddr");
                paVar10 = &local_208.field_2;
                paVar7 = &local_1e8.field_2;
                if (iVar4 != 0) {
                  std::operator+(&local_1c0,"        ",&pNVar11->name);
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_1c0," = PFN_");
                  local_1e8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                  paVar8 = &pbVar5->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p == paVar8) {
                    local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    local_1e8._M_dataplus._M_p = (pointer)paVar7;
                  }
                  else {
                    local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  }
                  local_1e8._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_1e8,(local_210->name)._M_dataplus._M_p,
                                     (local_210->name)._M_string_length);
                  local_208._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                  paVar8 = &pbVar5->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p == paVar8) {
                    local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    local_208._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  }
                  local_208._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_208,"( vkGetInstanceProcAddr( instance, \"");
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar5->_M_dataplus)._M_p;
                  paVar9 = &pbVar5->field_2;
                  if (paVar8 == paVar9) {
                    local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  }
                  else {
                    local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_230._M_dataplus._M_p = (pointer)paVar8;
                  }
                  local_230._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_230,(local_210->name)._M_dataplus._M_p,
                                     (local_210->name)._M_string_length);
                  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar5->_M_dataplus)._M_p;
                  paVar9 = &pbVar5->field_2;
                  if (paVar8 == paVar9) {
                    local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  }
                  else {
                    local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_250._M_dataplus._M_p = (pointer)paVar8;
                  }
                  local_250._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_250,"\" ) );\n");
                  local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                  paVar8 = &pbVar5->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p == paVar8) {
                    local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    local_270._M_dataplus._M_p = (pointer)paVar1;
                  }
                  else {
                    local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  }
                  local_270._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_190,local_270._M_dataplus._M_p,local_270._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p != paVar1) {
                    operator_delete(local_270._M_dataplus._M_p,
                                    local_270.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_250._M_dataplus._M_p != &local_250.field_2) {
                    operator_delete(local_250._M_dataplus._M_p,
                                    local_250.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != &local_230.field_2) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != paVar10) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p != paVar7) {
                    operator_delete(local_1e8._M_dataplus._M_p,
                                    local_1e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  pNVar11 = local_210;
                  p_Var2 = (_Base_ptr)(local_210->name)._M_string_length;
                  if ((p_Var2 != local_198[1]._M_parent) ||
                     ((p_Var2 != (_Base_ptr)0x0 &&
                      (iVar4 = bcmp((local_210->name)._M_dataplus._M_p,*(void **)local_1a0,
                                    (size_t)p_Var2), iVar4 != 0)))) {
                    std::operator+(&local_1c0,"        if ( !",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1a0);
                    pbVar5 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_1c0," ) ");
                    local_1e8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                    paVar8 = &pbVar5->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._M_dataplus._M_p == paVar8) {
                      local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                      local_1e8._M_dataplus._M_p = (pointer)paVar7;
                    }
                    else {
                      local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    }
                    local_1e8._M_string_length = pbVar5->_M_string_length;
                    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar5->_M_string_length = 0;
                    (pbVar5->field_2)._M_local_buf[0] = '\0';
                    pbVar5 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             _M_append(&local_1e8,*(char **)(local_198 + 1),
                                       (size_type)local_198[1]._M_parent);
                    local_208._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                    paVar8 = &pbVar5->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._M_dataplus._M_p == paVar8) {
                      local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                      local_208._M_dataplus._M_p = (pointer)paVar10;
                    }
                    else {
                      local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    }
                    local_208._M_string_length = pbVar5->_M_string_length;
                    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar5->_M_string_length = 0;
                    (pbVar5->field_2)._M_local_buf[0] = '\0';
                    pbVar5 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_208," = ");
                    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar5->_M_dataplus)._M_p;
                    paVar9 = &pbVar5->field_2;
                    if (paVar8 == paVar9) {
                      local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                      local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    }
                    else {
                      local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                      local_230._M_dataplus._M_p = (pointer)paVar8;
                    }
                    local_230._M_string_length = pbVar5->_M_string_length;
                    (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                    pbVar5->_M_string_length = 0;
                    (pbVar5->field_2)._M_local_buf[0] = '\0';
                    pbVar5 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             _M_append(&local_230,(local_210->name)._M_dataplus._M_p,
                                       (local_210->name)._M_string_length);
                    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar5->_M_dataplus)._M_p;
                    paVar9 = &pbVar5->field_2;
                    if (paVar8 == paVar9) {
                      local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                      local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    }
                    else {
                      local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                      local_250._M_dataplus._M_p = (pointer)paVar8;
                    }
                    local_250._M_string_length = pbVar5->_M_string_length;
                    (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                    pbVar5->_M_string_length = 0;
                    (pbVar5->field_2)._M_local_buf[0] = '\0';
                    pbVar5 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             append(&local_250,";\n");
                    local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                    paVar8 = &pbVar5->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270._M_dataplus._M_p == paVar8) {
                      local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                      local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                      local_270._M_dataplus._M_p = (pointer)paVar1;
                    }
                    else {
                      local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    }
                    local_270._M_string_length = pbVar5->_M_string_length;
                    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                    pbVar5->_M_string_length = 0;
                    (pbVar5->field_2)._M_local_buf[0] = '\0';
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_190,local_270._M_dataplus._M_p,local_270._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270._M_dataplus._M_p != paVar1) {
                      operator_delete(local_270._M_dataplus._M_p,
                                      local_270.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_250._M_dataplus._M_p != &local_250.field_2) {
                      operator_delete(local_250._M_dataplus._M_p,
                                      local_250.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_230._M_dataplus._M_p != &local_230.field_2) {
                      operator_delete(local_230._M_dataplus._M_p,
                                      local_230.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._M_dataplus._M_p != paVar10) {
                      operator_delete(local_208._M_dataplus._M_p,
                                      local_208.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._M_dataplus._M_p != paVar7) {
                      operator_delete(local_1e8._M_dataplus._M_p,
                                      local_1e8.field_2._M_allocated_capacity + 1);
                    }
                    pNVar11 = local_210;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                      operator_delete(local_1c0._M_dataplus._M_p,
                                      local_1c0.field_2._M_allocated_capacity + 1);
                      pNVar11 = local_210;
                    }
                  }
                }
                std::operator+(&local_208,"      PFN_",&pNVar11->name);
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_208," ");
                local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if (paVar7 == paVar8) {
                  local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                }
                else {
                  local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_230._M_dataplus._M_p = (pointer)paVar7;
                }
                local_230._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_230,(local_210->name)._M_dataplus._M_p,
                                   (local_210->name)._M_string_length);
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if (paVar7 == paVar8) {
                  local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                }
                else {
                  local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_250._M_dataplus._M_p = (pointer)paVar7;
                }
                local_250._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_250," = 0;\n");
                local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar7 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p == paVar7) {
                  local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                  local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_270._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                }
                local_270._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_110,local_270._M_dataplus._M_p,local_270._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != paVar1) {
                  operator_delete(local_270._M_dataplus._M_p,
                                  local_270.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  local_250.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p,
                                  local_230.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != paVar10) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_250,"      PFN_dummy ",&local_210->name);
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_250,"_placeholder = 0;\n");
                local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar10 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p == paVar10) {
                  local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_270._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                }
                local_270._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar10;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_130,local_270._M_dataplus._M_p,local_270._M_string_length);
              }
              else {
                std::operator+(&local_1c0,"        ",&local_210->name);
                paVar10 = &local_208.field_2;
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_1c0," = PFN_");
                paVar7 = &local_1e8.field_2;
                local_1e8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p == paVar8) {
                  local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_1e8._M_dataplus._M_p = (pointer)paVar7;
                }
                else {
                  local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                }
                local_1e8._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_1e8,(local_210->name)._M_dataplus._M_p,
                                   (local_210->name)._M_string_length);
                local_208._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p == paVar8) {
                  local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_208._M_dataplus._M_p = (pointer)paVar10;
                }
                else {
                  local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                }
                local_208._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_208,"( vkGetDeviceProcAddr( device, \"");
                local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar5->_M_dataplus)._M_p;
                paVar9 = &pbVar5->field_2;
                if (paVar8 == paVar9) {
                  local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                }
                else {
                  local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_230._M_dataplus._M_p = (pointer)paVar8;
                }
                local_230._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_230,(local_210->name)._M_dataplus._M_p,
                                   (local_210->name)._M_string_length);
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar5->_M_dataplus)._M_p;
                paVar9 = &pbVar5->field_2;
                if (paVar8 == paVar9) {
                  local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                }
                else {
                  local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_250._M_dataplus._M_p = (pointer)paVar8;
                }
                local_250._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_250,"\" ) );\n");
                local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p == paVar8) {
                  local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_270._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                }
                local_270._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_170,local_270._M_dataplus._M_p,local_270._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != paVar1) {
                  operator_delete(local_270._M_dataplus._M_p,
                                  local_270.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  local_250.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p,
                                  local_230.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != paVar10) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar7) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                  operator_delete(local_1c0._M_dataplus._M_p,
                                  local_1c0.field_2._M_allocated_capacity + 1);
                }
                p_Var2 = (_Base_ptr)(local_210->name)._M_string_length;
                if ((p_Var2 != local_198[1]._M_parent) ||
                   ((p_Var2 != (_Base_ptr)0x0 &&
                    (iVar4 = bcmp((local_210->name)._M_dataplus._M_p,*(void **)p_Var14,
                                  (size_t)p_Var2), iVar4 != 0)))) {
                  std::operator+(&local_1c0,"        if ( !",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var14);
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_1c0," ) ");
                  local_1e8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                  paVar8 = &pbVar5->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p == paVar8) {
                    local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    local_1e8._M_dataplus._M_p = (pointer)paVar7;
                  }
                  else {
                    local_1e8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  }
                  local_1e8._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_1e8,*(char **)(local_198 + 1),
                                     (size_type)local_198[1]._M_parent);
                  local_208._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                  paVar8 = &pbVar5->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p == paVar8) {
                    local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    local_208._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_208.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  }
                  local_208._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_208," = ");
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar5->_M_dataplus)._M_p;
                  paVar9 = &pbVar5->field_2;
                  if (paVar8 == paVar9) {
                    local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  }
                  else {
                    local_230.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_230._M_dataplus._M_p = (pointer)paVar8;
                  }
                  local_230._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_230,(local_210->name)._M_dataplus._M_p,
                                     (local_210->name)._M_string_length);
                  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(pbVar5->_M_dataplus)._M_p;
                  paVar9 = &pbVar5->field_2;
                  if (paVar8 == paVar9) {
                    local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  }
                  else {
                    local_250.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_250._M_dataplus._M_p = (pointer)paVar8;
                  }
                  local_250._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  pbVar5 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_250,";\n");
                  local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                  paVar8 = &pbVar5->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p == paVar8) {
                    local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                    local_270._M_dataplus._M_p = (pointer)paVar1;
                  }
                  else {
                    local_270.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  }
                  local_270._M_string_length = pbVar5->_M_string_length;
                  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                  pbVar5->_M_string_length = 0;
                  (pbVar5->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_170,local_270._M_dataplus._M_p,local_270._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p != paVar1) {
                    operator_delete(local_270._M_dataplus._M_p,
                                    local_270.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_250._M_dataplus._M_p != &local_250.field_2) {
                    operator_delete(local_250._M_dataplus._M_p,
                                    local_250.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != &local_230.field_2) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != paVar10) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p != paVar7) {
                    operator_delete(local_1e8._M_dataplus._M_p,
                                    local_1e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                }
                std::operator+(&local_208,"      PFN_",&local_210->name);
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_208," ");
                local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if (paVar7 == paVar8) {
                  local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                }
                else {
                  local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_230._M_dataplus._M_p = (pointer)paVar7;
                }
                local_230._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_230,(local_210->name)._M_dataplus._M_p,
                                   (local_210->name)._M_string_length);
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pbVar5->_M_dataplus)._M_p;
                paVar8 = &pbVar5->field_2;
                if (paVar7 == paVar8) {
                  local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                }
                else {
                  local_250.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
                  local_250._M_dataplus._M_p = (pointer)paVar7;
                }
                local_250._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_250," = 0;\n");
                local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar7 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p == paVar7) {
                  local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                  local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_270._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_270.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
                }
                local_270._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_d0,local_270._M_dataplus._M_p,local_270._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != paVar1) {
                  operator_delete(local_270._M_dataplus._M_p,
                                  local_270.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  local_250.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p,
                                  local_230.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_dataplus._M_p != paVar10) {
                  operator_delete(local_208._M_dataplus._M_p,
                                  local_208.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_250,"      PFN_dummy ",&local_210->name);
                pbVar5 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_250,"_placeholder = 0;\n");
                local_270._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                paVar10 = &pbVar5->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p == paVar10) {
                  local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                  local_270._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                }
                local_270._M_string_length = pbVar5->_M_string_length;
                (pbVar5->_M_dataplus)._M_p = (pointer)paVar10;
                pbVar5->_M_string_length = 0;
                (pbVar5->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_f0,local_270._M_dataplus._M_p,local_270._M_string_length);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != paVar1) {
                operator_delete(local_270._M_dataplus._M_p,
                                local_270.field_2._M_allocated_capacity + 1);
              }
              uVar12 = local_250.field_2._M_allocated_capacity;
              _Var13._M_p = local_250._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
LAB_00130a5a:
                operator_delete(_Var13._M_p,uVar12 + 1);
              }
            }
          }
          pNVar11 = local_210 + 1;
        } while (pNVar11 != local_38);
      }
      pRVar6 = local_50 + 1;
    } while (pRVar6 != local_58);
  }
  title_00 = local_60;
  paVar1 = &local_250.field_2;
  local_250._M_string_length = 0;
  local_250.field_2._M_allocated_capacity =
       local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_250._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_270,local_1c8,local_60,&local_90,&local_250);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (local_68,local_270._M_dataplus._M_p,local_270._M_string_length);
  paVar10 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_250._M_string_length = 0;
  local_250.field_2._M_allocated_capacity =
       local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_250._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_270,local_1c8,title_00,&local_b0,&local_250);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (local_70,local_270._M_dataplus._M_p,local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_250._M_string_length = 0;
  local_250.field_2._M_allocated_capacity =
       local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_250._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_270,local_1c8,title_00,&local_170,&local_250);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (deviceAssignments,local_270._M_dataplus._M_p,local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  addTitleAndProtection(&local_270,local_1c8,title_00,&local_d0,&local_f0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (deviceMembers,local_270._M_dataplus._M_p,local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  local_250._M_string_length = 0;
  local_250.field_2._M_allocated_capacity =
       local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_250._M_dataplus._M_p = (pointer)paVar1;
  addTitleAndProtection(&local_270,local_1c8,title_00,&local_190,&local_250);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (instanceAssignments,local_270._M_dataplus._M_p,local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar1) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  addTitleAndProtection(&local_270,local_1c8,title_00,&local_110,&local_130);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (instanceMembers,local_270._M_dataplus._M_p,local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,
                    CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                             local_190.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void VulkanHppGenerator::appendRAIIDispatcherCommands( std::vector<RequireData> const & requireData,
                                                       std::set<std::string> &          listedCommands,
                                                       std::string const &              title,
                                                       std::string &                    contextInitializers,
                                                       std::string &                    contextMembers,
                                                       std::string &                    deviceAssignments,
                                                       std::string &                    deviceMembers,
                                                       std::string &                    instanceAssignments,
                                                       std::string &                    instanceMembers ) const
{
  std::string ci, cm, da, dm, dmp, ia, im, imp;
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      if ( listedCommands.insert( command.name ).second )
      {
        auto commandIt = findByNameOrAlias( m_commands, command.name );
        if ( commandIt->second.handle.empty() )
        {
          ci += ", " + command.name + "( PFN_" + command.name + "( getProcAddr( NULL, \"" + command.name + "\" ) ) )";

          cm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
        }
        else if ( ( commandIt->second.handle == "VkDevice" ) || hasParentHandle( commandIt->second.handle, "VkDevice" ) )
        {
          da += "        " + command.name + " = PFN_" + command.name + "( vkGetDeviceProcAddr( device, \"" + command.name + "\" ) );\n";
          // if this is an alias'ed function, use it as a fallback for the original one
          if ( command.name != commandIt->first )
          {
            da += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
          }

          dm += "      PFN_" + command.name + " " + command.name + " = 0;\n";
          dmp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
        else
        {
          assert( ( commandIt->second.handle == "VkInstance" ) || hasParentHandle( commandIt->second.handle, "VkInstance" ) );

          // filter out vkGetInstanceProcAddr, as starting with Vulkan 1.2 it can resolve itself only (!) with an
          // instance nullptr !
          if ( command.name != "vkGetInstanceProcAddr" )
          {
            ia += "        " + command.name + " = PFN_" + command.name + "( vkGetInstanceProcAddr( instance, \"" + command.name + "\" ) );\n";
            // if this is an alias'ed function, use it as a fallback for the original one
            if ( command.name != commandIt->first )
            {
              ia += "        if ( !" + commandIt->first + " ) " + commandIt->first + " = " + command.name + ";\n";
            }
          }

          im += +"      PFN_" + command.name + " " + command.name + " = 0;\n";
          imp += "      PFN_dummy " + command.name + "_placeholder = 0;\n";
        }
      }
    }
  }
  contextInitializers += addTitleAndProtection( title, ci );
  contextMembers += addTitleAndProtection( title, cm );
  deviceAssignments += addTitleAndProtection( title, da );
  deviceMembers += addTitleAndProtection( title, dm, dmp );
  instanceAssignments += addTitleAndProtection( title, ia );
  instanceMembers += addTitleAndProtection( title, im, imp );
}